

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReportUnexpectedOpcode
          (BinaryReader *this,Opcode opcode,char *where)

{
  bool bVar1;
  size_type sVar2;
  byte *pbVar3;
  undefined8 uVar4;
  string local_a0;
  byte local_79;
  iterator iStack_78;
  uint8_t byte;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_40 [8];
  string message;
  char *where_local;
  BinaryReader *this_local;
  Opcode opcode_local;
  
  message.field_2._8_8_ = where;
  this_local._0_4_ = opcode.enum_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"unexpected opcode",
             (allocator<char> *)
             ((long)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  if (message.field_2._8_8_ != 0) {
    std::__cxx11::string::operator+=(local_40,' ');
    std::__cxx11::string::operator+=(local_40,(char *)message.field_2._8_8_);
  }
  std::__cxx11::string::operator+=(local_40,":");
  Opcode::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2,
                   (Opcode *)&this_local);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
  if (sVar2 != 0) {
    __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
    iStack_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88);
      if (!bVar1) break;
      pbVar3 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end2);
      local_79 = *pbVar3;
      StringPrintf_abi_cxx11_(&local_a0," 0x%x",(ulong)local_79);
      std::__cxx11::string::operator+=(local_40,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end2);
    }
    uVar4 = std::__cxx11::string::c_str();
    PrintError(this,"%s",uVar4);
    Result::Result((Result *)((long)&this_local + 4),Error);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2);
    std::__cxx11::string::~string(local_40);
    return (Result)this_local._4_4_;
  }
  __assert_fail("bytes.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader.cc"
                ,0x105,
                "Result wabt::(anonymous namespace)::BinaryReader::ReportUnexpectedOpcode(Opcode, const char *)"
               );
}

Assistant:

Result BinaryReader::ReportUnexpectedOpcode(Opcode opcode, const char* where) {
  std::string message = "unexpected opcode";
  if (where) {
    message += ' ';
    message += where;
  }

  message += ":";

  std::vector<uint8_t> bytes = opcode.GetBytes();
  assert(bytes.size() > 0);

  for (uint8_t byte : bytes) {
    message += StringPrintf(" 0x%x", byte);
  }

  PrintError("%s", message.c_str());
  return Result::Error;
}